

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeLocalGet(TranslateToFuzzReader *this,Type type)

{
  char cVar1;
  uint32_t uVar2;
  Index index_00;
  mapped_type *pmVar3;
  value_type_conflict3 *pvVar4;
  LocalGet *pLVar5;
  Expression *pEVar6;
  LocalSet *pLVar7;
  value_type_conflict3 index_01;
  Index local_2c;
  Type TStack_28;
  Index index;
  Type type_local;
  
  TStack_28.id = type.id;
  pmVar3 = std::__detail::
           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->funcContext->typeLocals,&stack0xffffffffffffffd8);
  if ((pmVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pmVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    if (((this->trivialNesting != 0) || (uVar2 = Random::upTo(&this->random,3), uVar2 == 0)) ||
       (cVar1 = wasm::TypeUpdating::canHandleAsLocal(TStack_28), cVar1 == '\0')) {
      pEVar6 = makeConst(this,TStack_28);
      return pEVar6;
    }
    index_00 = Builder::addVar(this->funcContext->func,TStack_28);
    local_2c = index_00;
    if ((uVar2 == 1) || ((TStack_28.id & 3) == 0 && 6 < TStack_28.id)) {
      pEVar6 = make(this,TStack_28);
      pLVar7 = Builder::makeLocalTee(&this->builder,index_00,pEVar6,TStack_28);
    }
    else {
      pLVar7 = (LocalSet *)0x0;
    }
    pmVar3 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->funcContext->typeLocals,&stack0xffffffffffffffd8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar3,&local_2c);
    index_01 = local_2c;
    if (pLVar7 != (LocalSet *)0x0) {
      return (Expression *)pLVar7;
    }
  }
  else {
    pvVar4 = Random::pick<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                       (&this->random,pmVar3);
    index_01 = *pvVar4;
  }
  pLVar5 = Builder::makeLocalGet(&this->builder,index_01,TStack_28);
  return (Expression *)pLVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeLocalGet(Type type) {
  auto& locals = funcContext->typeLocals[type];
  if (!locals.empty()) {
    return builder.makeLocalGet(pick(locals), type);
  }
  // No existing local. When we want something trivial, just give up and emit a
  // constant.
  if (trivialNesting) {
    return makeConst(type);
  }

  // Otherwise, we have 3 cases: a const, as above (we do this randomly some of
  // the time), or emit a local.get of a new local, or emit a local.tee of a new
  // local.
  auto choice = upTo(3);
  if (choice == 0 || !TypeUpdating::canHandleAsLocal(type)) {
    return makeConst(type);
  }
  // Otherwise, add a new local. If the type is not non-nullable then we may
  // just emit a get for it (which, as this is a brand-new local, will read the
  // default value, unless we are in a loop; for that reason for a non-
  // nullable local we prefer a tee later down.).
  auto index = builder.addVar(funcContext->func, type);
  LocalSet* tee = nullptr;
  if (choice == 1 || type.isNonNullable()) {
    // Create the tee here before adding the local to typeLocals (or else we
    // might end up using it prematurely inside the make() call).
    tee = builder.makeLocalTee(index, make(type), type);
  }
  funcContext->typeLocals[type].push_back(index);
  if (tee) {
    return tee;
  }
  return builder.makeLocalGet(index, type);
}